

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O0

ze_result_t driver::zeMemFree(ze_context_handle_t hContext,void *ptr)

{
  ze_pfnMemFree_t pfnFree;
  ze_result_t result;
  void *ptr_local;
  ze_context_handle_t hContext_local;
  
  pfnFree._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011c500 != (code *)0x0) {
    pfnFree._4_4_ = (*DAT_0011c500)(hContext,ptr);
  }
  return pfnFree._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeMemFree(
        ze_context_handle_t hContext,                   ///< [in] handle of the context object
        void* ptr                                       ///< [in][release] pointer to memory to free
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnFree = context.zeDdiTable.Mem.pfnFree;
        if( nullptr != pfnFree )
        {
            result = pfnFree( hContext, ptr );
        }
        else
        {
            // generic implementation
        }

        return result;
    }